

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall
OSSLEVPSymmetricAlgorithm::encryptFinal(OSSLEVPSymmetricAlgorithm *this,ByteString *encryptedData)

{
  Type TVar1;
  EVP_CIPHER_CTX *pEVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  uchar *puVar6;
  ulong e;
  char *pcVar7;
  int outLen;
  ByteString tag;
  int local_64;
  size_t local_60;
  ByteString local_58;
  
  TVar1 = (this->super_SymmetricAlgorithm).currentCipherMode;
  sVar5 = (this->super_SymmetricAlgorithm).currentTagBytes;
  bVar3 = SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,encryptedData);
  if (bVar3) {
    local_60 = sVar5;
    iVar4 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    ByteString::resize(encryptedData,CONCAT44(extraout_var,iVar4));
    sVar5 = ByteString::size(encryptedData);
    local_64 = (int)sVar5;
    pEVar2 = (EVP_CIPHER_CTX *)this->pCurCTX;
    puVar6 = ByteString::operator[](encryptedData,0);
    iVar4 = EVP_EncryptFinal(pEVar2,puVar6,&local_64);
    bVar3 = iVar4 != 0;
    if (iVar4 == 0) {
      e = ERR_get_error();
      pcVar7 = ERR_error_string(e,(char *)0x0);
      softHSMLog(3,"encryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x117,"EVP_EncryptFinal failed: %s",pcVar7);
    }
    else {
      ByteString::resize(encryptedData,(long)local_64);
      if (TVar1 == GCM) {
        ByteString::ByteString(&local_58);
        sVar5 = local_60;
        ByteString::resize(&local_58,local_60);
        pEVar2 = (EVP_CIPHER_CTX *)this->pCurCTX;
        puVar6 = ByteString::operator[](&local_58,0);
        EVP_CIPHER_CTX_ctrl(pEVar2,0x10,(int)sVar5,puVar6);
        ByteString::operator+=(encryptedData,&local_58);
        local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_58.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
    }
    clean(this);
  }
  else {
    clean(this);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::encryptFinal(ByteString& encryptedData)
{
	SymMode::Type mode = currentCipherMode;
	size_t tagBytes = currentTagBytes;

	if (!SymmetricAlgorithm::encryptFinal(encryptedData))
	{
		clean();
		return false;
	}

	// Prepare the output block
	encryptedData.resize(getBlockSize());

	int outLen = encryptedData.size();

	if (!EVP_EncryptFinal(pCurCTX, &encryptedData[0], &outLen))
	{
		ERROR_MSG("EVP_EncryptFinal failed: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		return false;
	}

	// Resize the output block
	encryptedData.resize(outLen);

	if (mode == SymMode::GCM)
	{
		ByteString tag;
		tag.resize(tagBytes);
		EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_GET_TAG, tagBytes, &tag[0]);
		encryptedData += tag;
	}

	clean();

	return true;
}